

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_notif(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node_notif **notifs)

{
  ly_stmt lVar1;
  lysp_node_notif *plVar2;
  LY_ERR LVar3;
  lysp_node_notif *parent_00;
  char *pcVar4;
  ly_ctx *local_d8;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  LY_ERR ret___16;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_notif *notif;
  lysp_node_notif **notifs_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    parent_00 = (lysp_node_notif *)calloc(1,0x60);
    if (parent_00 == (lysp_node_notif *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_b0 = (ly_ctx *)0x0;
      }
      else {
        local_b0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_notif");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      if (*notifs == (lysp_node_notif *)0x0) {
        *notifs = parent_00;
      }
      else {
        plVar2 = *notifs;
        while (plStack_58 = (long *)((long)plVar2 + (long)*notifs + (0x10 - (long)*notifs)),
              *plStack_58 != 0) {
          plVar2 = (lysp_node_notif *)*plStack_58;
        }
        *plStack_58 = (long)parent_00;
      }
      if (ctx == (lysp_ctx *)0x0) {
        local_b8 = (ly_ctx *)0x0;
      }
      else {
        local_b8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert(local_b8,stmt->arg,0,&(parent_00->field_0).node.name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x400;
        (parent_00->field_0).node.parent = parent;
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_ANYDATA) {
            if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema
                < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                local_c8 = (ly_ctx *)0x0;
              }
              else {
                local_c8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"anydata","notification");
              return LY_EVALID;
            }
LAB_001aa48d:
            LVar3 = lysp_stmt_any(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
          }
          else {
            if (lVar1 == LY_STMT_ANYXML) goto LAB_001aa48d;
            if (lVar1 == LY_STMT_CHOICE) {
              LVar3 = lysp_stmt_case(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_CONTAINER) {
              LVar3 = lysp_stmt_container(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_GROUPING) {
              LVar3 = lysp_stmt_grouping(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->groupings);
            }
            else if (lVar1 == LY_STMT_LEAF) {
              LVar3 = lysp_stmt_leaf(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_LEAF_LIST) {
              LVar3 = lysp_stmt_leaflist(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_LIST) {
              LVar3 = lysp_stmt_list(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_USES) {
              LVar3 = lysp_stmt_uses(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->child);
            }
            else if (lVar1 == LY_STMT_DESCRIPTION) {
              LVar3 = lysp_stmt_text_field
                                (ctx,_ret___3,0,&(parent_00->field_0).node.dsc,Y_STR_ARG,
                                 &(parent_00->field_0).node.exts);
            }
            else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
              LVar3 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_NOTIFICATION,0,
                                    &(parent_00->field_0).node.exts);
            }
            else if (lVar1 == LY_STMT_IF_FEATURE) {
              LVar3 = lysp_stmt_qnames(ctx,_ret___3,&(parent_00->field_0).node.iffeatures,Y_STR_ARG,
                                       &(parent_00->field_0).node.exts);
            }
            else if (lVar1 == LY_STMT_MUST) {
              if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].
                            schema < 2) {
                if (ctx == (lysp_ctx *)0x0) {
                  local_d0 = (ly_ctx *)0x0;
                }
                else {
                  local_d0 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                        ,"must","notification");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_restrs(ctx,_ret___3,&parent_00->musts);
            }
            else if (lVar1 == LY_STMT_REFERENCE) {
              LVar3 = lysp_stmt_text_field
                                (ctx,_ret___3,0,&(parent_00->field_0).node.ref,Y_STR_ARG,
                                 &(parent_00->field_0).node.exts);
            }
            else if (lVar1 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,_ret___3,&(parent_00->field_0).node.flags,
                                       &(parent_00->field_0).node.exts);
            }
            else {
              if (lVar1 != LY_STMT_TYPEDEF) {
                if (ctx == (lysp_ctx *)0x0) {
                  local_d8 = (ly_ctx *)0x0;
                }
                else {
                  local_d8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
                ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"notification");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_typedef(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->typedefs);
            }
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_notif(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_notif **notifs)
{
    struct lysp_node_notif *notif;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), notifs, notif, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &notif->name));
    notif->nodetype = LYS_NOTIF;
    notif->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &notif->dsc, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &notif->iffeatures, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &notif->ref, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &notif->flags, &notif->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "notification");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_case(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &notif->node, &notif->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &notif->node, &notif->child));
            break;

        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", "notification");
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &notif->musts));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &notif->node, &notif->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &notif->node, &notif->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_NOTIFICATION, 0, &notif->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "notification");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}